

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::operator==(SplitBranchNode *this,Node *other)

{
  UBool UVar1;
  bool local_31;
  SplitBranchNode *o;
  Node *other_local;
  SplitBranchNode *this_local;
  
  if (this == (SplitBranchNode *)other) {
    this_local._7_1_ = true;
  }
  else {
    UVar1 = Node::operator==((Node *)this,other);
    if (UVar1 == '\0') {
      this_local._7_1_ = false;
    }
    else {
      local_31 = false;
      if ((*(short *)&(this->super_BranchNode).field_0x14 ==
           *(short *)((long)&other[1].super_UObject._vptr_UObject + 4)) &&
         (local_31 = false, this->lessThan == *(Node **)&other[1].hash)) {
        local_31 = this->greaterOrEqual == (Node *)other[2].super_UObject._vptr_UObject;
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
StringTrieBuilder::SplitBranchNode::operator==(const Node &other) const {
    if(this==&other) {
        return TRUE;
    }
    if(!Node::operator==(other)) {
        return FALSE;
    }
    const SplitBranchNode &o=(const SplitBranchNode &)other;
    return unit==o.unit && lessThan==o.lessThan && greaterOrEqual==o.greaterOrEqual;
}